

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  ArenaStringPtr *this_00;
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  string *output;
  stringpiece_ssize_type in_R9;
  StringPiece message_name;
  StringPiece type_url_prefix_00;
  string local_40;
  
  this_00 = this->type_url_;
  InitProtobufDefaults();
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  puVar1 = *(undefined8 **)(CONCAT44(extraout_var,iVar2) + 8);
  message_name.length_ = (stringpiece_ssize_type)(type_url_prefix->_M_dataplus)._M_p;
  message_name.ptr_ = (char *)puVar1[1];
  type_url_prefix_00.length_ = in_R9;
  type_url_prefix_00.ptr_ = (char *)type_url_prefix->_M_string_length;
  GetTypeUrl_abi_cxx11_(&local_40,(internal *)*puVar1,message_name,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(this_00,(string *)fixed_address_empty_string_abi_cxx11_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  output = ArenaStringPtr::MutableNoArena
                     (this->value_,(string *)fixed_address_empty_string_abi_cxx11_);
  MessageLite::SerializeToString(&message->super_MessageLite,output);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const std::string& type_url_prefix) {
  type_url_->SetNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString(),
      GetTypeUrl(message.GetDescriptor()->full_name(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited()));
}